

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnElemSegment
          (SharedValidator *this,Location *loc,Var *table_var,SegmentKind kind)

{
  pointer *ppEVar1;
  iterator __position;
  Result RVar2;
  Enum EVar3;
  TableType table_type;
  ElemType local_a0;
  TableType local_88;
  Var local_68;
  
  local_88.element.enum_ = Any;
  local_88.element.type_index_ = 0xffffffff;
  local_88.limits.initial = 0;
  local_88.limits.max._0_7_ = 0;
  local_88.limits._15_4_ = 0;
  EVar3 = Ok;
  if (kind == Active) {
    Var::Var(&local_68,table_var);
    RVar2 = CheckTableIndex(this,&local_68,&local_88);
    EVar3 = (Enum)(RVar2.enum_ == Error);
    Var::~Var(&local_68);
  }
  local_a0.element.enum_ = Void;
  local_a0.element.type_index_ = 0xffffffff;
  local_a0.is_active = kind == Active;
  local_a0.table_type.enum_ = local_88.element.enum_;
  local_a0.table_type.type_index_ = local_88.element.type_index_;
  __position._M_current =
       (this->elems_).
       super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->elems_).
      super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
    _M_realloc_insert<wabt::SharedValidator::ElemType>(&this->elems_,__position,&local_a0);
  }
  else {
    ((__position._M_current)->table_type).type_index_ = local_a0.table_type.type_index_;
    ((__position._M_current)->element).enum_ = Void;
    ((__position._M_current)->element).type_index_ = 0xffffffff;
    (__position._M_current)->is_active = kind == Active;
    *(undefined3 *)&(__position._M_current)->field_0x9 = local_a0._9_3_;
    ((__position._M_current)->table_type).enum_ = local_a0.table_type.enum_;
    ppEVar1 = &(this->elems_).
               super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnElemSegment(const Location& loc,
                                      Var table_var,
                                      SegmentKind kind) {
  Result result = Result::Ok;
  TableType table_type;
  if (kind == SegmentKind::Active) {
    result |= CheckTableIndex(table_var, &table_type);
  }
  // Type gets set later in OnElemSegmentElemType.
  elems_.push_back(
      ElemType{Type::Void, kind == SegmentKind::Active, table_type.element});
  return result;
}